

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

WINDOW * winBorder(int height,int width,int starty,int startx)

{
  WINDOW *pWVar1;
  undefined8 uVar2;
  WINDOW *tmpWin;
  WINDOW *win;
  int startx_local;
  int starty_local;
  int width_local;
  int height_local;
  
  pWVar1 = (WINDOW *)newwin(height,width,starty,startx);
  uVar2 = newwin(height + 2,width + 2,starty + -1,startx + -1);
  box(uVar2,0);
  wrefresh(uVar2);
  wrefresh(pWVar1);
  return pWVar1;
}

Assistant:

WINDOW *winBorder(int height, int width, int starty, int startx) {
  WINDOW *win;
  win = newwin(height, width, starty, startx);

  WINDOW *tmpWin;
  tmpWin = newwin(height + 2, width + 2, starty - 1, startx - 1);

  box(tmpWin,0,0);
  wrefresh(tmpWin);
  wrefresh(win);
  return win;
}